

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O2

void __thiscall QHttpHeaders::removeAll(QHttpHeaders *this,QAnyStringView name)

{
  QHttpHeadersPrivate *pQVar1;
  long in_FS_OFFSET;
  _Variant_storage<false,_QHttpHeaders::WellKnownHeader,_QByteArray> _Stack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 != (QHttpHeadersPrivate *)0x0) && ((pQVar1->headers).d.size != 0)) {
    HeaderName::HeaderName((HeaderName *)&_Stack_38,name);
    QHttpHeadersPrivate::removeAll(&this->d,(HeaderName *)&_Stack_38);
    std::__detail::__variant::_Variant_storage<false,_QHttpHeaders::WellKnownHeader,_QByteArray>::
    _M_reset(&_Stack_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpHeaders::removeAll(QAnyStringView name)
{
    if (isEmpty())
        return;

    return QHttpHeadersPrivate::removeAll(d, HeaderName(name));
}